

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O0

void __thiscall
immutable::ref<immutable::rrb<int,_false,_5>_>::~ref(ref<immutable::rrb<int,_false,_5>_> *this)

{
  ref<immutable::rrb<int,_false,_5>_> *this_local;
  
  rrb_details::release<int,5>(this->ptr);
  return;
}

Assistant:

ref<T>::~ref()
      {
      rrb_details::release(ptr);
      }